

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1444.cpp
# Opt level: O0

int comp(void *v1,void *v2)

{
  point *p2;
  point *p1;
  void *v2_local;
  void *v1_local;
  
  if (*(double *)((long)v1 + 0x10) - *(double *)((long)v2 + 0x10) <= 1e-10) {
    if (-1e-10 <= *(double *)((long)v1 + 0x10) - *(double *)((long)v2 + 0x10)) {
      if ((*v2 - p[0].x) * (*v2 - p[0].x) +
          (*(long *)((long)v2 + 8) - p[0].y) * (*(long *)((long)v2 + 8) - p[0].y) <
          (*v1 - p[0].x) * (*v1 - p[0].x) +
          (*(long *)((long)v1 + 8) - p[0].y) * (*(long *)((long)v1 + 8) - p[0].y)) {
        v1_local._4_4_ = 1;
      }
      else {
        v1_local._4_4_ = -1;
      }
    }
    else {
      v1_local._4_4_ = -1;
    }
  }
  else {
    v1_local._4_4_ = 1;
  }
  return v1_local._4_4_;
}

Assistant:

int comp(const void *v1, const void *v2) {
    const point *p1 = (point *) v1;
    const point *p2 = (point *) v2;
    if (p1->angle - p2->angle > 1e-10) {
        return 1;
    } else if (p1->angle - p2->angle < -1e-10) {
        return -1;
    } else {
        if ((p1->x - p[0].x) * (p1->x - p[0].x) + (p1->y - p[0].y) * (p1->y - p[0].y) >
            (p2->x - p[0].x) * (p2->x - p[0].x) + (p2->y - p[0].y) * (p2->y - p[0].y)) {
            return 1;
        } else {
            return -1;
        }
    }
}